

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall tcu::Matrix<tcu::Interval,_3,_4>::Matrix(Matrix<tcu::Interval,_3,_4> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  uint uVar5;
  
  Vector<tcu::Vector<tcu::Interval,_3>,_4>::Vector(&this->m_data);
  pdVar4 = &(this->m_data).m_data[0].m_data[0].m_hi;
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0x120; lVar3 = lVar3 + 0x48) {
      uVar5 = 0x3ff00000;
      if (lVar1 != lVar3) {
        uVar5 = 0;
      }
      *(undefined1 *)((long)pdVar4 + lVar3 + -0x10) = 0;
      *(ulong *)((long)pdVar4 + lVar3 + -8) = (ulong)uVar5 << 0x20;
      *(ulong *)((long)pdVar4 + lVar3) = (ulong)uVar5 << 0x20;
    }
    pdVar4 = pdVar4 + 3;
    lVar1 = lVar1 + 0x48;
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}